

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O3

bool rsg::anon_unknown_13::compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIsSubsetOf>
               (ConstValueRangeAccess *a,ConstValueRangeAccess *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  Type TVar5;
  VariableType *pVVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  long lVar16;
  bool bVar17;
  ConstValueRangeAccess local_60;
  ConstValueRangeAccess local_48;
  
  pVVar6 = a->m_type;
  TVar5 = pVVar6->m_baseType;
  if (TVar5 == TYPE_ARRAY) {
    iVar8 = pVVar6->m_numElements;
    if (0 < iVar8) {
      iVar12 = 0;
      do {
        iVar9 = VariableType::getElementScalarOffset(a->m_type,iVar12);
        local_48.m_type = VariableType::getElementType(a->m_type);
        local_48.m_min = a->m_min + iVar9;
        local_48.m_max = a->m_max + iVar9;
        iVar9 = VariableType::getElementScalarOffset(b->m_type,iVar12);
        local_60.m_type = VariableType::getElementType(b->m_type);
        local_60.m_min = b->m_min + iVar9;
        local_60.m_max = b->m_max + iVar9;
        bVar7 = compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIsSubsetOf>
                          (&local_48,&local_60);
        if (!bVar7) {
          return bVar7;
        }
        bVar17 = iVar8 + -1 != iVar12;
        iVar12 = iVar12 + 1;
      } while (bVar17);
      return bVar7;
    }
  }
  else if (TVar5 == TYPE_STRUCT) {
    uVar11 = (int)((long)(pVVar6->m_members).
                         super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pVVar6->m_members).
                         super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
    if (0 < (int)uVar11) {
      lVar16 = 0;
      lVar14 = 0;
      do {
        iVar8 = VariableType::getMemberScalarOffset(a->m_type,(int)lVar14);
        local_48.m_type =
             *(VariableType **)
              ((long)&((a->m_type->m_members).
                       super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar16);
        local_48.m_min = a->m_min + iVar8;
        local_48.m_max = a->m_max + iVar8;
        iVar8 = VariableType::getMemberScalarOffset(b->m_type,(int)lVar14);
        local_60.m_min = b->m_min + iVar8;
        local_60.m_max = b->m_max + iVar8;
        local_60.m_type =
             *(VariableType **)
              ((long)&((b->m_type->m_members).
                       super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar16);
        bVar7 = compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIsSubsetOf>
                          (&local_48,&local_60);
        if (!bVar7) {
          return bVar7;
        }
        lVar16 = lVar16 + 0x28;
        bVar17 = (ulong)(uVar11 & 0x7fffffff) - 1 != lVar14;
        lVar14 = lVar14 + 1;
      } while (bVar17);
      return bVar7;
    }
  }
  else {
    bVar7 = false;
    if (6 < TVar5 - TYPE_FLOAT) {
      return false;
    }
    uVar11 = pVVar6->m_numElements;
    uVar10 = (ulong)uVar11;
    switch(TVar5) {
    case TYPE_FLOAT:
      if (0 < (int)uVar11) {
        uVar13 = 0;
        do {
          VariableType::getElementType(a->m_type);
          fVar1 = a->m_min[uVar13].floatVal;
          VariableType::getElementType(a->m_type);
          fVar2 = a->m_max[uVar13].floatVal;
          VariableType::getElementType(b->m_type);
          fVar3 = b->m_min[uVar13].floatVal;
          VariableType::getElementType(b->m_type);
          if (fVar1 < fVar3) {
            return false;
          }
          if (b->m_max[uVar13].floatVal < fVar1) {
            return false;
          }
          if (fVar2 < fVar3) {
            return false;
          }
          if (b->m_max[uVar13].floatVal < fVar2) {
            return false;
          }
          uVar13 = uVar13 + 1;
        } while (uVar10 != uVar13);
      }
      break;
    default:
      if (0 < (int)uVar11) {
        uVar13 = 0;
        do {
          VariableType::getElementType(a->m_type);
          iVar8 = a->m_min[uVar13].intVal;
          VariableType::getElementType(a->m_type);
          iVar12 = a->m_max[uVar13].intVal;
          VariableType::getElementType(b->m_type);
          iVar9 = b->m_min[uVar13].intVal;
          VariableType::getElementType(b->m_type);
          if (iVar8 < iVar9) {
            return false;
          }
          if (b->m_max[uVar13].intVal < iVar8) {
            return false;
          }
          if (iVar12 < iVar9) {
            return false;
          }
          if (b->m_max[uVar13].intVal < iVar12) {
            return false;
          }
          uVar13 = uVar13 + 1;
        } while (uVar10 != uVar13);
      }
      break;
    case TYPE_BOOL:
      if (0 < (int)uVar11) {
        uVar13 = 0;
        do {
          VariableType::getElementType(a->m_type);
          bVar7 = a->m_min[uVar13].boolVal;
          VariableType::getElementType(a->m_type);
          bVar17 = a->m_max[uVar13].boolVal;
          VariableType::getElementType(b->m_type);
          bVar4 = b->m_min[uVar13].boolVal;
          VariableType::getElementType(b->m_type);
          bVar15 = bVar4 ^ 1;
          if ((bVar7 | bVar15) != 1) {
            return false;
          }
          if (bVar7 == true && b->m_max[uVar13].boolVal == false) {
            return false;
          }
          if ((bVar15 | bVar17) != 1) {
            return false;
          }
          if (bVar17 == true && b->m_max[uVar13].boolVal == false) {
            return false;
          }
          uVar13 = uVar13 + 1;
        } while (uVar10 != uVar13);
      }
      break;
    case TYPE_STRUCT:
    case TYPE_ARRAY:
      goto switchD_005adf24_caseD_4;
    }
  }
  bVar7 = true;
switchD_005adf24_caseD_4:
  return bVar7;
}

Assistant:

bool compareValueRangesAllTrue (const ConstValueRangeAccess& a, const ConstValueRangeAccess& b)
{
	DE_ASSERT(a.getType() == b.getType());

	if (a.getType().isStruct())
	{
		int numMembers = (int)a.getType().getMembers().size();
		for (int ndx = 0; ndx < numMembers; ndx++)
		{
			if (!compareValueRangesAllTrue<CompareOp>(a.member(ndx), b.member(ndx)))
				return false;
		}
	}
	else if (a.getType().isArray())
	{
		int numElements = (int)a.getType().getNumElements();
		for (int ndx = 0; ndx < numElements; ndx++)
		{
			if (!compareValueRangesAllTrue<CompareOp>(a.arrayElement(ndx), b.arrayElement(ndx)))
				return false;
		}
	}
	else
	{
		int numElements = (int)a.getType().getNumElements();
		switch (a.getType().getBaseType())
		{
			case VariableType::TYPE_FLOAT:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					float aMin = a.component(ndx).getMin().asFloat();
					float aMax = a.component(ndx).getMax().asFloat();
					float bMin = b.component(ndx).getMin().asFloat();
					float bMax = b.component(ndx).getMax().asFloat();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			case VariableType::TYPE_INT:
			case VariableType::TYPE_SAMPLER_2D:
			case VariableType::TYPE_SAMPLER_CUBE:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					int aMin = a.component(ndx).getMin().asInt();
					int aMax = a.component(ndx).getMax().asInt();
					int bMin = b.component(ndx).getMin().asInt();
					int bMax = b.component(ndx).getMax().asInt();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			case VariableType::TYPE_BOOL:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					bool aMin = a.component(ndx).getMin().asBool();
					bool aMax = a.component(ndx).getMax().asBool();
					bool bMin = b.component(ndx).getMin().asBool();
					bool bMax = b.component(ndx).getMax().asBool();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			default:
				DE_ASSERT(DE_FALSE);
				return false;
		}
	}

	return true;
}